

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner-scan.c
# Opt level: O0

gboolean loudness_scan_parse(int *argc,char ***argv)

{
  gboolean gVar1;
  int iVar2;
  gboolean success;
  char ***argv_local;
  int *argc_local;
  
  gVar1 = parse_mode_args(argc,argv,entries);
  if ((((peak != (gchar *)0x0) && (iVar2 = strcmp(peak,"sample"), iVar2 != 0)) &&
      (iVar2 = strcmp(peak,"true"), iVar2 != 0)) &&
     ((iVar2 = strcmp(peak,"dbtp"), iVar2 != 0 && (iVar2 = strcmp(peak,"all"), iVar2 != 0)))) {
    fprintf(_stderr,"Invalid argument to --peak!\n");
    return 0;
  }
  if (gVar1 == 0) {
    if (*argc == 1) {
      fprintf(_stderr,"Missing arguments\n");
    }
    argc_local._4_4_ = 0;
  }
  else {
    argc_local._4_4_ = 1;
  }
  return argc_local._4_4_;
}

Assistant:

gboolean
loudness_scan_parse(int *argc, char **argv[])
{
	gboolean success = parse_mode_args(argc, argv, entries);
	if (peak && strcmp(peak, "sample") && strcmp(peak, "true") &&
	    strcmp(peak, "dbtp") && strcmp(peak, "all")) {
		fprintf(stderr, "Invalid argument to --peak!\n");
		return FALSE;
	}
	if (!success) {
		if (*argc == 1)
			fprintf(stderr, "Missing arguments\n");
		return FALSE;
	}
	return TRUE;
}